

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

vector<CScript,_std::allocator<CScript>_> *
EvalDescriptorStringOrObject
          (vector<CScript,_std::allocator<CScript>_> *__return_storage_ptr__,UniValue *scanobject,
          FlatSigningProvider *provider,bool expand_priv)

{
  bool bVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  char cVar5;
  string *psVar6;
  UniValue *pUVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  CScript *__args;
  long in_FS_OFFSET;
  pair<long,_long> pVar12;
  string_view key;
  string_view key_00;
  vector<CScript,_std::allocator<CScript>_> scripts;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  descs;
  string error;
  string desc_str;
  undefined1 local_c8 [32];
  undefined8 *local_a8;
  string local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  if (scanobject->typ == VOBJ) {
    key._M_str = "desc";
    key._M_len = 4;
    pUVar7 = UniValue::find_value(scanobject,key);
    if (pUVar7->typ == VNULL) {
      pUVar7 = (UniValue *)__cxa_allocate_exception(0x58);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"Descriptor needs to be provided in scan object","");
      JSONRPCError(pUVar7,-8,&local_78);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar7,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_003847a4;
    }
    psVar6 = UniValue::get_str_abi_cxx11_(pUVar7);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&local_58,psVar6);
    key_00._M_str = "range";
    key_00._M_len = 5;
    pUVar7 = UniValue::find_value(scanobject,key_00);
    if (pUVar7->typ == VNULL) goto LAB_003842e2;
    pVar12 = ParseDescriptorRange(pUVar7);
    uVar11 = pVar12.second;
    uVar8 = (ulong)(int)pVar12.first;
  }
  else {
    if (scanobject->typ != VSTR) {
      pUVar7 = (UniValue *)__cxa_allocate_exception(0x58);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"Scan object needs to be either a string or an object","");
      JSONRPCError(pUVar7,-8,&local_78);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar7,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_003847a4;
    }
    psVar6 = UniValue::get_str_abi_cxx11_(scanobject);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&local_58,psVar6);
LAB_003842e2:
    uVar11 = 1000;
    uVar8 = 0;
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  Parse((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
         *)(local_c8 + 0x18),&local_58,provider,&local_78,false);
  if ((undefined8 *)local_c8._24_8_ == local_a8) {
    pUVar7 = (UniValue *)__cxa_allocate_exception(0x58);
    JSONRPCError(pUVar7,-5,&local_78);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(pUVar7,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else {
    cVar5 = (**(code **)(**(long **)local_c8._24_8_ + 0x10))();
    if (cVar5 == '\0') {
      uVar11 = 0;
    }
    (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (cVar5 == '\0') {
      uVar8 = 0;
    }
    puVar2 = (undefined8 *)local_c8._24_8_;
    puVar3 = local_a8;
    if ((long)uVar8 <= (long)uVar11) {
      do {
        for (; puVar4 = local_a8, puVar2 != local_a8; puVar2 = puVar2 + 1) {
          args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
          local_c8._0_8_ = (CScript *)0x0;
          local_c8._8_8_ = (pointer)0x0;
          local_c8._16_8_ = 0;
          local_a8 = puVar3;
          cVar5 = (**(code **)(*(long *)*puVar2 + 0x40))
                            ((long *)*puVar2,uVar8 & 0xffffffff,provider,args,provider,0);
          if (cVar5 == '\0') {
            pUVar7 = (UniValue *)__cxa_allocate_exception(0x58);
            tinyformat::format<std::__cxx11::string>
                      (&local_98,(tinyformat *)"Cannot derive script without private keys: \'%s\'",
                       (char *)&local_58,args);
            JSONRPCError(pUVar7,-5,&local_98);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(pUVar7,&UniValue::typeinfo,UniValue::~UniValue);
            }
            goto LAB_003847a4;
          }
          if (expand_priv) {
            (**(code **)(*(long *)*puVar2 + 0x50))
                      ((long *)*puVar2,uVar8 & 0xffffffff,provider,provider);
          }
          lVar9 = (long)(local_c8._8_8_ - local_c8._0_8_) >> 5;
          if (0 < lVar9) {
            uVar10 = lVar9 + 1;
            __args = (CScript *)local_c8._0_8_;
            do {
              std::vector<CScript,_std::allocator<CScript>_>::emplace_back<CScript>
                        (__return_storage_ptr__,__args);
              __args = __args + 1;
              uVar10 = uVar10 - 1;
            } while (1 < uVar10);
          }
          std::vector<CScript,_std::allocator<CScript>_>::~vector
                    ((vector<CScript,_std::allocator<CScript>_> *)local_c8);
          puVar3 = local_a8;
          local_a8 = puVar4;
        }
        bVar1 = (long)uVar8 < (long)uVar11;
        puVar2 = (undefined8 *)local_c8._24_8_;
        local_a8 = puVar3;
        uVar8 = uVar8 + 1;
      } while (bVar1);
    }
    std::
    vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
    ::~vector((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
               *)(local_c8 + 0x18));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                               local_78.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return __return_storage_ptr__;
    }
  }
LAB_003847a4:
  __stack_chk_fail();
}

Assistant:

std::vector<CScript> EvalDescriptorStringOrObject(const UniValue& scanobject, FlatSigningProvider& provider, const bool expand_priv)
{
    std::string desc_str;
    std::pair<int64_t, int64_t> range = {0, 1000};
    if (scanobject.isStr()) {
        desc_str = scanobject.get_str();
    } else if (scanobject.isObject()) {
        const UniValue& desc_uni{scanobject.find_value("desc")};
        if (desc_uni.isNull()) throw JSONRPCError(RPC_INVALID_PARAMETER, "Descriptor needs to be provided in scan object");
        desc_str = desc_uni.get_str();
        const UniValue& range_uni{scanobject.find_value("range")};
        if (!range_uni.isNull()) {
            range = ParseDescriptorRange(range_uni);
        }
    } else {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Scan object needs to be either a string or an object");
    }

    std::string error;
    auto descs = Parse(desc_str, provider, error);
    if (descs.empty()) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, error);
    }
    if (!descs.at(0)->IsRange()) {
        range.first = 0;
        range.second = 0;
    }
    std::vector<CScript> ret;
    for (int i = range.first; i <= range.second; ++i) {
        for (const auto& desc : descs) {
            std::vector<CScript> scripts;
            if (!desc->Expand(i, provider, scripts, provider)) {
                throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, strprintf("Cannot derive script without private keys: '%s'", desc_str));
            }
            if (expand_priv) {
                desc->ExpandPrivate(/*pos=*/i, provider, /*out=*/provider);
            }
            std::move(scripts.begin(), scripts.end(), std::back_inserter(ret));
        }
    }
    return ret;
}